

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O3

int rtosc_arg_val_negate(rtosc_arg_val_t *av)

{
  char cVar1;
  int iVar2;
  
  cVar1 = av->type;
  iVar2 = 0;
  switch(cVar1) {
  case 'c':
  case 'i':
    (av->val).i = -(av->val).i;
    break;
  case 'd':
    (av->val).t = (av->val).t ^ 0x8000000000000000;
    break;
  case 'e':
  case 'g':
    goto switchD_00110cab_caseD_65;
  case 'f':
    (av->val).i = (av->val).i ^ 0x80000000;
    break;
  case 'h':
    (av->val).h = -(av->val).h;
    break;
  default:
    if (cVar1 == 'F') {
      (av->val).T = '\x01';
      av->type = 'T';
    }
    else {
      if (cVar1 != 'T') {
        return 0;
      }
      (av->val).T = '\0';
      av->type = 'F';
    }
  }
  iVar2 = 1;
switchD_00110cab_caseD_65:
  return iVar2;
}

Assistant:

int rtosc_arg_val_negate(rtosc_arg_val_t* av)
{
    switch(av->type)
    {
        case 'h': av->val.h = -av->val.h; return true;
        case 'd': av->val.d = -av->val.d; return true;
        case 'f': av->val.f = -av->val.f; return true;
        case 'c':
        case 'i': av->val.i = -av->val.i; return true;
        case 'T': av->val.T = 0; av->type = 'F'; return true;
        case 'F': av->val.T = 1; av->type = 'T'; return true;
        default: return false;
    }
}